

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O1

int png_colorspace_set_chromaticities
              (png_const_structrp png_ptr,png_colorspacerp colorspace,png_xy *xy,int preferred)

{
  byte *pbVar1;
  int iVar2;
  png_XYZ XYZ;
  png_XYZ local_44;
  
  iVar2 = png_colorspace_check_xy(&local_44,xy);
  if (iVar2 == 1) {
    pbVar1 = (byte *)((long)&colorspace->flags + 1);
    *pbVar1 = *pbVar1 | 0x80;
    png_benign_error(png_ptr,"invalid chromaticities");
    iVar2 = 0;
  }
  else {
    if (iVar2 != 0) {
      pbVar1 = (byte *)((long)&colorspace->flags + 1);
      *pbVar1 = *pbVar1 | 0x80;
      png_error(png_ptr,"internal error checking chromaticities");
    }
    iVar2 = png_colorspace_set_xy_and_XYZ(png_ptr,colorspace,xy,&local_44,preferred);
  }
  return iVar2;
}

Assistant:

int /* PRIVATE */
png_colorspace_set_chromaticities(png_const_structrp png_ptr,
    png_colorspacerp colorspace, const png_xy *xy, int preferred)
{
   /* We must check the end points to ensure they are reasonable - in the past
    * color management systems have crashed as a result of getting bogus
    * colorant values, while this isn't the fault of libpng it is the
    * responsibility of libpng because PNG carries the bomb and libpng is in a
    * position to protect against it.
    */
   png_XYZ XYZ;

   switch (png_colorspace_check_xy(&XYZ, xy))
   {
      case 0: /* success */
         return png_colorspace_set_xy_and_XYZ(png_ptr, colorspace, xy, &XYZ,
             preferred);

      case 1:
         /* We can't invert the chromaticities so we can't produce value XYZ
          * values.  Likely as not a color management system will fail too.
          */
         colorspace->flags |= PNG_COLORSPACE_INVALID;
         png_benign_error(png_ptr, "invalid chromaticities");
         break;

      default:
         /* libpng is broken; this should be a warning but if it happens we
          * want error reports so for the moment it is an error.
          */
         colorspace->flags |= PNG_COLORSPACE_INVALID;
         png_error(png_ptr, "internal error checking chromaticities");
   }

   return 0; /* failed */
}